

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-xml-cpp.cpp
# Opt level: O0

void test_xml_parse_document_1(void)

{
  bool bVar1;
  uint8_t *buffer;
  size_t length;
  xml_document *document_00;
  xml_node *pxVar2;
  xml_string *pxVar3;
  size_t sVar4;
  xml_node *node;
  xml_node *node_00;
  bool local_39;
  xml_node *third_child;
  xml_node *second_child;
  xml_node *first_child;
  xml_node *root;
  xml_document *document;
  uint8_t *source;
  
  buffer = (uint8_t *)calloc(0x5b,1);
  memcpy(buffer,
         "<Parent>\n\t<Child>\n\t\tFirst content\n\t</Child>\n\t<Child>\n\t\tSecond content\n\t</Child>\n</Parent>\n"
         ,0x5b);
  length = strlen((char *)buffer);
  document_00 = xml_parse_document(buffer,length);
  _assert_that(document_00 != (xml_document *)0x0,"Could not parse document",
               "test_xml_parse_document_1",
               "/workspace/llm4binary/github/license_c_cmakelists/ooxi[P]xml/test/test-xml-cpp.cpp",
               0x76);
  pxVar2 = xml_document_root(document_00);
  pxVar3 = xml_node_name(pxVar2);
  bVar1 = string_equals(pxVar3,"Parent");
  _assert_that(bVar1,"root node name must be `Parent\'","test_xml_parse_document_1",
               "/workspace/llm4binary/github/license_c_cmakelists/ooxi[P]xml/test/test-xml-cpp.cpp",
               0x79);
  sVar4 = xml_node_children(pxVar2);
  _assert_that(sVar4 == 2,"root must have two children","test_xml_parse_document_1",
               "/workspace/llm4binary/github/license_c_cmakelists/ooxi[P]xml/test/test-xml-cpp.cpp",
               0x7a);
  node = xml_node_child(pxVar2,0);
  node_00 = xml_node_child(pxVar2,1);
  local_39 = node != (xml_node *)0x0 && node_00 != (xml_node *)0x0;
  _assert_that(local_39,"Failed retrieving the children of root","test_xml_parse_document_1",
               "/workspace/llm4binary/github/license_c_cmakelists/ooxi[P]xml/test/test-xml-cpp.cpp",
               0x7e);
  pxVar2 = xml_node_child(pxVar2,2);
  _assert_that((bool)((pxVar2 != (xml_node *)0x0 ^ 0xffU) & 1),
               "root has a third child where non should be","test_xml_parse_document_1",
               "/workspace/llm4binary/github/license_c_cmakelists/ooxi[P]xml/test/test-xml-cpp.cpp",
               0x80);
  pxVar3 = xml_node_name(node);
  bVar1 = string_equals(pxVar3,"Child");
  _assert_that(bVar1,"first_child node name must be `Child\'","test_xml_parse_document_1",
               "/workspace/llm4binary/github/license_c_cmakelists/ooxi[P]xml/test/test-xml-cpp.cpp",
               0x82);
  pxVar3 = xml_node_content(node);
  bVar1 = string_equals(pxVar3,"First content");
  _assert_that(bVar1,"first_child node content must be `First content\'","test_xml_parse_document_1"
               ,"/workspace/llm4binary/github/license_c_cmakelists/ooxi[P]xml/test/test-xml-cpp.cpp"
               ,0x84);
  pxVar3 = xml_node_name(node_00);
  bVar1 = string_equals(pxVar3,"Child");
  _assert_that(bVar1,"second_child node name must be `Child\'","test_xml_parse_document_1",
               "/workspace/llm4binary/github/license_c_cmakelists/ooxi[P]xml/test/test-xml-cpp.cpp",
               0x86);
  pxVar3 = xml_node_content(node_00);
  bVar1 = string_equals(pxVar3,"Second content");
  _assert_that(bVar1,"second_child node content must be `tSecond content\'",
               "test_xml_parse_document_1",
               "/workspace/llm4binary/github/license_c_cmakelists/ooxi[P]xml/test/test-xml-cpp.cpp",
               0x88);
  xml_document_free(document_00,true);
  return;
}

Assistant:

static void test_xml_parse_document_1() {
	SOURCE(source, ""
		"<Parent>\n"
		"\t<Child>\n"
		"\t\tFirst content\n"
		"\t</Child>\n"
		"\t<Child>\n"
		"\t\tSecond content\n"
		"\t</Child>\n"
		"</Parent>\n"
	);
	struct xml_document* document = xml_parse_document(source,
	  strlen((const char *)source));
	assert_that(document, "Could not parse document");
	struct xml_node* root = xml_document_root(document);
	assert_that(string_equals(xml_node_name(root), "Parent"),
	  "root node name must be `Parent'");
	assert_that(2 == xml_node_children(root), "root must have two children");
	struct xml_node* first_child = xml_node_child(root, 0);
	struct xml_node* second_child = xml_node_child(root, 1);
	assert_that(first_child && second_child,
	  "Failed retrieving the children of root");
	struct xml_node* third_child = xml_node_child(root, 2);
	assert_that(!third_child, "root has a third child where non should be");
	assert_that(string_equals(xml_node_name(first_child), "Child"),
	  "first_child node name must be `Child'");
	assert_that(string_equals(xml_node_content(first_child), "First content"),
	  "first_child node content must be `First content'");
	assert_that(string_equals(xml_node_name(second_child), "Child"),
	  "second_child node name must be `Child'");
	assert_that(string_equals(xml_node_content(second_child), "Second content"),
	  "second_child node content must be `tSecond content'");
	xml_document_free(document, true);
}